

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p.cc
# Opt level: O3

void lambdatwist::compute_eig3x3known0(Matrix3d *M,Matrix3d *E,double *sig1,double *sig2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double __tmp;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  
  dVar7 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  dVar8 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar12 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [4];
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  dVar13 = (-dVar7 - dVar12) - dVar1;
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar7 = dVar13 * dVar13 * 0.25 -
          (dVar12 * dVar1 +
          (dVar12 + dVar1) * dVar7 + ((-dVar8 * dVar8 - dVar2 * dVar2) - dVar3 * dVar3));
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  *sig1 = dVar13 * -0.5 + dVar7;
  dVar7 = dVar13 * -0.5 - dVar7;
  *sig2 = dVar7;
  dVar8 = *sig1;
  if (ABS(dVar8) < ABS(dVar7)) {
    *sig1 = dVar7;
    *sig2 = dVar8;
    dVar8 = *sig1;
  }
  dVar7 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar12 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [0];
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar13 = ((dVar8 * dVar8 + dVar12 * dVar7) - (dVar12 + dVar7) * dVar8) - dVar1 * dVar1;
  auVar9._0_8_ = (dVar8 * dVar2 + dVar1 * dVar3) - dVar7 * dVar2;
  auVar9._8_8_ = (dVar8 * dVar3 + dVar2 * dVar1) - dVar3 * dVar12;
  auVar5._8_8_ = dVar13;
  auVar5._0_8_ = dVar13;
  auVar10 = divpd(auVar9,auVar5);
  dVar7 = auVar10._0_8_;
  dVar8 = auVar10._8_8_;
  dVar12 = 1.0 / SQRT(dVar8 * dVar8 + dVar7 * dVar7 + 1.0);
  auVar10._8_4_ = SUB84(dVar12 * dVar8,0);
  auVar10._0_8_ = dVar12 * dVar7;
  auVar10._12_4_ = (int)((ulong)(dVar12 * dVar8) >> 0x20);
  *(undefined1 (*) [16])
   (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array =
       auVar10;
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar12;
  dVar7 = *sig2;
  dVar8 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar12 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [0];
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar13 = ((dVar7 * dVar7 + dVar12 * dVar8) - (dVar12 + dVar8) * dVar7) - dVar1 * dVar1;
  auVar11._0_8_ = (dVar7 * dVar2 + dVar1 * dVar3) - dVar8 * dVar2;
  auVar11._8_8_ = (dVar7 * dVar3 + dVar2 * dVar1) - dVar3 * dVar12;
  auVar6._8_8_ = dVar13;
  auVar6._0_8_ = dVar13;
  auVar10 = divpd(auVar11,auVar6);
  dVar8 = auVar10._0_8_;
  dVar12 = auVar10._8_8_;
  dVar7 = 1.0 / SQRT(dVar12 * dVar12 + dVar8 * dVar8 + 1.0);
  auVar4._8_4_ = SUB84(dVar7 * dVar12,0);
  auVar4._0_8_ = dVar7 * dVar8;
  auVar4._12_4_ = (int)((ulong)(dVar7 * dVar12) >> 0x20);
  *(undefined1 (*) [16])
   ((E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array + 3) =
       auVar4;
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       dVar7;
  return;
}

Assistant:

void compute_eig3x3known0(const Eigen::Matrix3d &M, Eigen::Matrix3d &E, double &sig1, double &sig2) {

    // In the original paper there is a missing minus sign here (for M(0,0))
    double p1 = -M(0,0) - M(1,1) - M(2,2);
    double p0 = -M(0,1)*M(0,1) - M(0,2)*M(0,2) - M(1,2)*M(1,2) + M(0,0) * (M(1,1) + M(2,2)) + M(1,1)*M(2,2);

    double disc = std::sqrt(p1*p1/4.0 - p0);
    double tmp = -p1/2.0;
    sig1 = tmp + disc;
    sig2 = tmp - disc;

    if(std::abs(sig1) < std::abs(sig2))
        std::swap(sig1,sig2);

    double c = sig1*sig1 + M(0,0)*M(1,1) - sig1 * (M(0,0) + M(1,1)) - M(0,1)*M(0,1);
    double a1 = (sig1 * M(0,2) + M(0,1)*M(1,2) - M(0,2) * M(1,1)) / c;
    double a2 = (sig1 * M(1,2) + M(0,1)*M(0,2) - M(0,0) * M(1,2)) / c;
    double n = 1.0 / std::sqrt(1 + a1*a1 + a2*a2);
    E.col(0) << a1*n, a2*n, n;

    c = sig2*sig2 + M(0,0)*M(1,1) - sig2 * (M(0,0) + M(1,1)) - M(0,1)*M(0,1);
    a1 = (sig2 * M(0,2) + M(0,1)*M(1,2) - M(0,2) * M(1,1)) / c;
    a2 = (sig2 * M(1,2) + M(0,1)*M(0,2) - M(0,0) * M(1,2)) / c;
    n = 1.0 / std::sqrt(1 + a1*a1 + a2*a2);
    E.col(1) << a1*n, a2*n, n;

    // This is never used so we don't compute it
    //E.col(2) = M.col(1).cross(M.col(2)).normalized();
}